

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

void __thiscall
Am_Value_List::Insert(Am_Value_List *this,Am_Value *value,Am_Insert_Position position,bool unique)

{
  Am_List_Item *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_List_Item *pAVar3;
  Am_Value_List_Data *this_00;
  Am_List_Item **ppAVar4;
  
  this_00 = this->data;
  if (this_00 == (Am_Value_List_Data *)0x0) {
    this_00 = (Am_Value_List_Data *)operator_new(0x20);
    Am_Value_List_Data::Am_Value_List_Data(this_00);
  }
  else {
    if ((!unique) || ((this_00->super_Am_Wrapper).refs == 1)) goto LAB_0022cedd;
    iVar2 = (*(this_00->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                      (this_00);
    this_00 = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar2);
    pAVar3 = this->item;
    if (pAVar3 != (Am_List_Item *)0x0) {
      ppAVar4 = &this_00->head;
      do {
        pAVar3 = pAVar3->prev;
        pAVar1 = *ppAVar4;
        ppAVar4 = &pAVar1->next;
      } while (pAVar3 != (Am_List_Item *)0x0);
      this->item = pAVar1;
    }
  }
  this->data = this_00;
LAB_0022cedd:
  Am_Value_List_Data::Insert(this_00,value,this->item,position);
  return;
}

Assistant:

void Am_Value_List::Insert(const Am_Value &value,
                                           Am_Insert_Position position,
                                           bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Value_List_Data();
  data->Insert(value, item, position);
}